

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.hpp
# Opt level: O0

string * __thiscall
Disa::Matrix_Sparse::row_column_abi_cxx11_
          (string *__return_storage_ptr__,Matrix_Sparse *this,size_t i_row,size_t i_column)

{
  string local_90;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  size_t local_20;
  size_t i_column_local;
  size_t i_row_local;
  
  local_20 = i_row;
  i_column_local = (size_t)this;
  i_row_local = (size_t)__return_storage_ptr__;
  std::__cxx11::to_string(&local_60,(unsigned_long)this);
  std::operator+(&local_40,&local_60,", ");
  std::__cxx11::to_string(&local_90,local_20);
  std::operator+(__return_storage_ptr__,&local_40,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] static std::string row_column(std::size_t i_row, std::size_t i_column) {
    return std::to_string(i_row) + ", " + std::to_string(i_column);
  }